

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui_qfiledialog.h
# Opt level: O3

void __thiscall Ui_QFileDialog::setupUi(Ui_QFileDialog *this,QDialog *QFileDialog)

{
  QSizePolicy QVar1;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aVar2;
  QVBoxLayout *pQVar3;
  long in_FS_OFFSET;
  QAnyStringView QVar4;
  QAnyStringView QVar5;
  QAnyStringView QVar6;
  QAnyStringView QVar7;
  QAnyStringView QVar8;
  QAnyStringView QVar9;
  QAnyStringView QVar10;
  QAnyStringView QVar11;
  QAnyStringView QVar12;
  QAnyStringView QVar13;
  QAnyStringView QVar14;
  QAnyStringView QVar15;
  QAnyStringView QVar16;
  QAnyStringView QVar17;
  QAnyStringView QVar18;
  QAnyStringView QVar19;
  QAnyStringView QVar20;
  QAnyStringView QVar21;
  QAnyStringView QVar22;
  QAnyStringView QVar23;
  QAnyStringView QVar24;
  QAnyStringView QVar25;
  QAnyStringView QVar26;
  QAnyStringView QVar27;
  QAnyStringView QVar28;
  QAnyStringView QVar29;
  QAnyStringView QVar30;
  QSize local_48 [2];
  long local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  QObject::objectName();
  if (local_48[0] != (QSize)0x0) {
    LOCK();
    *(int *)local_48[0] = *(int *)local_48[0] + -1;
    UNLOCK();
    if (*(int *)local_48[0] == 0) {
      QArrayData::deallocate((QArrayData *)local_48[0],2,0x10);
    }
  }
  if (local_38 == 0) {
    QVar4.m_size = (size_t)"QFileDialog";
    QVar4.field_0.m_data = QFileDialog;
    QObject::setObjectName(QVar4);
  }
  local_48[0].wd.m_i = 0x209;
  local_48[0].ht.m_i = 0x13c;
  QWidget::resize(&QFileDialog->super_QWidget,local_48);
  QDialog::setSizeGripEnabled(QFileDialog,true);
  aVar2.m_data = operator_new(0x20);
  QGridLayout::QGridLayout((QGridLayout *)aVar2.m_data,&QFileDialog->super_QWidget);
  this->gridLayout = (QGridLayout *)aVar2;
  QVar5.m_size = (size_t)"gridLayout";
  QVar5.field_0.m_data = aVar2.m_data;
  QObject::setObjectName(QVar5);
  aVar2.m_data = operator_new(0x28);
  QLabel::QLabel((QLabel *)aVar2.m_data,&QFileDialog->super_QWidget,(WindowFlags)0x0);
  this->lookInLabel = (QLabel *)aVar2;
  QVar6.m_size = (size_t)"lookInLabel";
  QVar6.field_0.m_data = aVar2.m_data;
  QObject::setObjectName(QVar6);
  QGridLayout::addWidget(this->gridLayout,(QWidget *)this->lookInLabel,0,0,1,1,(Alignment)0x0);
  aVar2.m_data = operator_new(0x20);
  QHBoxLayout::QHBoxLayout((QHBoxLayout *)aVar2.m_data);
  this->hboxLayout = (QHBoxLayout *)aVar2;
  QVar7.m_size = (size_t)"hboxLayout";
  QVar7.field_0.m_data = aVar2.m_data;
  QObject::setObjectName(QVar7);
  aVar2.m_data = operator_new(0x50);
  QComboBox::QComboBox((QComboBox *)aVar2.m_data,&QFileDialog->super_QWidget);
  *(undefined ***)aVar2.m_data = &PTR_metaObject_00802018;
  *(undefined ***)((long)aVar2.m_data + 0x10) = &PTR__QFileDialogComboBox_008021e8;
  *(QUrlModel **)((long)aVar2.m_data + 0x28) = (QUrlModel *)0x0;
  *(QFileDialogPrivate **)((long)aVar2.m_data + 0x30) = (QFileDialogPrivate *)0x0;
  (((QStringList *)((long)aVar2.m_data + 0x38))->d).d = (Data *)0x0;
  *(QString **)((long)aVar2.m_data + 0x40) = (QString *)0x0;
  *(QWidgetData **)((long)aVar2.m_data + 0x48) = (QWidgetData *)0x0;
  this->lookInCombo = (QFileDialogComboBox *)aVar2;
  QVar8.m_size = (size_t)"lookInCombo";
  QVar8.field_0.m_data = aVar2.m_data;
  QObject::setObjectName(QVar8);
  QVar1 = QWidget::sizePolicy((QWidget *)this->lookInCombo);
  QWidget::setSizePolicy
            ((QWidget *)this->lookInCombo,
             (QSizePolicy)(((uint)QVar1.field_0 & 0x20000000) + 0xd0001));
  QWidget::setMinimumSize((QWidget *)this->lookInCombo,0x32,0);
  QBoxLayout::addWidget
            (&this->hboxLayout->super_QBoxLayout,(QWidget *)this->lookInCombo,0,(Alignment)0x0);
  aVar2.m_data = operator_new(0x28);
  QToolButton::QToolButton((QToolButton *)aVar2.m_data,&QFileDialog->super_QWidget);
  this->backButton = (QToolButton *)aVar2;
  QVar9.m_size = (size_t)"backButton";
  QVar9.field_0.m_data = aVar2.m_data;
  QObject::setObjectName(QVar9);
  QBoxLayout::addWidget
            (&this->hboxLayout->super_QBoxLayout,(QWidget *)this->backButton,0,(Alignment)0x0);
  aVar2.m_data = operator_new(0x28);
  QToolButton::QToolButton((QToolButton *)aVar2.m_data,&QFileDialog->super_QWidget);
  this->forwardButton = (QToolButton *)aVar2;
  QVar10.m_size = (size_t)"forwardButton";
  QVar10.field_0.m_data = aVar2.m_data;
  QObject::setObjectName(QVar10);
  QBoxLayout::addWidget
            (&this->hboxLayout->super_QBoxLayout,(QWidget *)this->forwardButton,0,(Alignment)0x0);
  aVar2.m_data = operator_new(0x28);
  QToolButton::QToolButton((QToolButton *)aVar2.m_data,&QFileDialog->super_QWidget);
  this->toParentButton = (QToolButton *)aVar2;
  QVar11.m_size = (size_t)"toParentButton";
  QVar11.field_0.m_data = aVar2.m_data;
  QObject::setObjectName(QVar11);
  QBoxLayout::addWidget
            (&this->hboxLayout->super_QBoxLayout,(QWidget *)this->toParentButton,0,(Alignment)0x0);
  aVar2.m_data = operator_new(0x28);
  QToolButton::QToolButton((QToolButton *)aVar2.m_data,&QFileDialog->super_QWidget);
  this->newFolderButton = (QToolButton *)aVar2;
  QVar12.m_size = (size_t)"newFolderButton";
  QVar12.field_0.m_data = aVar2.m_data;
  QObject::setObjectName(QVar12);
  QBoxLayout::addWidget
            (&this->hboxLayout->super_QBoxLayout,(QWidget *)this->newFolderButton,0,(Alignment)0x0);
  aVar2.m_data = operator_new(0x28);
  QToolButton::QToolButton((QToolButton *)aVar2.m_data,&QFileDialog->super_QWidget);
  this->listModeButton = (QToolButton *)aVar2;
  QVar13.m_size = (size_t)"listModeButton";
  QVar13.field_0.m_data = aVar2.m_data;
  QObject::setObjectName(QVar13);
  QBoxLayout::addWidget
            (&this->hboxLayout->super_QBoxLayout,(QWidget *)this->listModeButton,0,(Alignment)0x0);
  aVar2.m_data = operator_new(0x28);
  QToolButton::QToolButton((QToolButton *)aVar2.m_data,&QFileDialog->super_QWidget);
  this->detailModeButton = (QToolButton *)aVar2;
  QVar14.m_size = (size_t)"detailModeButton";
  QVar14.field_0.m_data = aVar2.m_data;
  QObject::setObjectName(QVar14);
  QBoxLayout::addWidget
            (&this->hboxLayout->super_QBoxLayout,(QWidget *)this->detailModeButton,0,(Alignment)0x0)
  ;
  QGridLayout::addLayout(this->gridLayout,(QLayout *)this->hboxLayout,0,1,1,2,(Alignment)0x0);
  aVar2.m_data = operator_new(0x28);
  QSplitter::QSplitter((QSplitter *)aVar2.m_data,&QFileDialog->super_QWidget);
  this->splitter = (QSplitter *)aVar2;
  QVar15.m_size = (size_t)"splitter";
  QVar15.field_0.m_data = aVar2.m_data;
  QObject::setObjectName(QVar15);
  QVar1 = QWidget::sizePolicy((QWidget *)this->splitter);
  QWidget::setSizePolicy
            ((QWidget *)this->splitter,(QSizePolicy)(((uint)QVar1.field_0 & 0x20000000) + 0x770000))
  ;
  QSplitter::setOrientation(this->splitter,Horizontal);
  QSplitter::setChildrenCollapsible(this->splitter,false);
  aVar2.m_data = operator_new(0x30);
  QSidebar::QSidebar((QSidebar *)aVar2.m_data,(QWidget *)this->splitter);
  this->sidebar = (QSidebar *)aVar2;
  QVar16.m_size = (size_t)"sidebar";
  QVar16.field_0.m_data = aVar2.m_data;
  QObject::setObjectName(QVar16);
  QSplitter::addWidget(this->splitter,(QWidget *)this->sidebar);
  aVar2.m_data = operator_new(0x28);
  QFrame::QFrame((QFrame *)aVar2.m_data,(QWidget *)this->splitter,(WindowFlags)0x0);
  this->frame = (QFrame *)aVar2;
  QVar17.m_size = (size_t)"frame";
  QVar17.field_0.m_data = aVar2.m_data;
  QObject::setObjectName(QVar17);
  QFrame::setFrameShape(this->frame,NoFrame);
  QFrame::setFrameShadow(this->frame,Raised);
  pQVar3 = (QVBoxLayout *)operator_new(0x20);
  QVBoxLayout::QVBoxLayout(pQVar3,&this->frame->super_QWidget);
  this->vboxLayout = pQVar3;
  (**(code **)(*(long *)&(pQVar3->super_QBoxLayout).super_QLayout + 0x68))(pQVar3,0);
  QVar18.m_size = (size_t)"vboxLayout";
  QVar18.field_0 =
       (anon_union_8_3_8ad491a7_for_QAnyStringView_6)
       (anon_union_8_3_8ad491a7_for_QAnyStringView_6)this->vboxLayout;
  QObject::setObjectName(QVar18);
  QLayout::setContentsMargins((QLayout *)this->vboxLayout,0,0,0,0);
  aVar2.m_data = operator_new(0x28);
  QStackedWidget::QStackedWidget((QStackedWidget *)aVar2.m_data,&this->frame->super_QWidget);
  this->stackedWidget = (QStackedWidget *)aVar2;
  QVar19.m_size = (size_t)"stackedWidget";
  QVar19.field_0.m_data = aVar2.m_data;
  QObject::setObjectName(QVar19);
  aVar2.m_data = operator_new(0x28);
  QWidget::QWidget((QWidget *)aVar2.m_data,(QWidget *)0x0,(WindowFlags)0x0);
  this->page = (QWidget *)aVar2;
  QVar20.m_size = (size_t)"page";
  QVar20.field_0.m_data = aVar2.m_data;
  QObject::setObjectName(QVar20);
  pQVar3 = (QVBoxLayout *)operator_new(0x20);
  QVBoxLayout::QVBoxLayout(pQVar3,this->page);
  this->vboxLayout1 = pQVar3;
  (**(code **)(*(long *)&(pQVar3->super_QBoxLayout).super_QLayout + 0x68))(pQVar3,0);
  QVar21.m_size = (size_t)"vboxLayout1";
  QVar21.field_0 =
       (anon_union_8_3_8ad491a7_for_QAnyStringView_6)
       (anon_union_8_3_8ad491a7_for_QAnyStringView_6)this->vboxLayout1;
  QObject::setObjectName(QVar21);
  QLayout::setContentsMargins((QLayout *)this->vboxLayout1,0,0,0,0);
  aVar2.m_data = operator_new(0x30);
  QListView::QListView((QListView *)aVar2.m_data,this->page);
  *(undefined ***)aVar2.m_data = &PTR_metaObject_00802250;
  *(undefined ***)((long)aVar2.m_data + 0x10) = &PTR__QFileDialogListView_00802560;
  *(QFileDialogPrivate **)((long)aVar2.m_data + 0x28) = (QFileDialogPrivate *)0x0;
  this->listView = (QFileDialogListView *)aVar2;
  QVar22.m_size = (size_t)"listView";
  QVar22.field_0.m_data = aVar2.m_data;
  QObject::setObjectName(QVar22);
  QBoxLayout::addWidget
            (&this->vboxLayout1->super_QBoxLayout,(QWidget *)this->listView,0,(Alignment)0x0);
  QStackedWidget::addWidget(this->stackedWidget,this->page);
  aVar2.m_data = operator_new(0x28);
  QWidget::QWidget((QWidget *)aVar2.m_data,(QWidget *)0x0,(WindowFlags)0x0);
  this->page_2 = (QWidget *)aVar2;
  QVar23.m_size = (size_t)"page_2";
  QVar23.field_0.m_data = aVar2.m_data;
  QObject::setObjectName(QVar23);
  pQVar3 = (QVBoxLayout *)operator_new(0x20);
  QVBoxLayout::QVBoxLayout(pQVar3,this->page_2);
  this->vboxLayout2 = pQVar3;
  (**(code **)(*(long *)&(pQVar3->super_QBoxLayout).super_QLayout + 0x68))(pQVar3,0);
  QVar24.m_size = (size_t)"vboxLayout2";
  QVar24.field_0 =
       (anon_union_8_3_8ad491a7_for_QAnyStringView_6)
       (anon_union_8_3_8ad491a7_for_QAnyStringView_6)this->vboxLayout2;
  QObject::setObjectName(QVar24);
  QLayout::setContentsMargins((QLayout *)this->vboxLayout2,0,0,0,0);
  aVar2.m_data = operator_new(0x30);
  QTreeView::QTreeView((QTreeView *)aVar2.m_data,this->page_2);
  *(undefined ***)aVar2.m_data = &PTR_metaObject_008025c8;
  *(undefined ***)((long)aVar2.m_data + 0x10) = &PTR__QFileDialogTreeView_008028e8;
  *(QFileDialogPrivate **)((long)aVar2.m_data + 0x28) = (QFileDialogPrivate *)0x0;
  this->treeView = (QFileDialogTreeView *)aVar2;
  QVar25.m_size = (size_t)"treeView";
  QVar25.field_0.m_data = aVar2.m_data;
  QObject::setObjectName(QVar25);
  QBoxLayout::addWidget
            (&this->vboxLayout2->super_QBoxLayout,(QWidget *)this->treeView,0,(Alignment)0x0);
  QStackedWidget::addWidget(this->stackedWidget,this->page_2);
  QBoxLayout::addWidget
            (&this->vboxLayout->super_QBoxLayout,(QWidget *)this->stackedWidget,0,(Alignment)0x0);
  QSplitter::addWidget(this->splitter,&this->frame->super_QWidget);
  QGridLayout::addWidget(this->gridLayout,(QWidget *)this->splitter,1,0,1,3,(Alignment)0x0);
  aVar2.m_data = operator_new(0x28);
  QLabel::QLabel((QLabel *)aVar2.m_data,&QFileDialog->super_QWidget,(WindowFlags)0x0);
  this->fileNameLabel = (QLabel *)aVar2;
  QVar26.m_size = (size_t)"fileNameLabel";
  QVar26.field_0.m_data = aVar2.m_data;
  QObject::setObjectName(QVar26);
  QVar1 = QWidget::sizePolicy((QWidget *)this->fileNameLabel);
  QWidget::setSizePolicy
            ((QWidget *)this->fileNameLabel,
             (QSizePolicy)(((uint)QVar1.field_0 & 0x20000000) + 0x510000));
  QWidget::setMinimumSize((QWidget *)this->fileNameLabel,0,0);
  QGridLayout::addWidget(this->gridLayout,(QWidget *)this->fileNameLabel,2,0,1,1,(Alignment)0x0);
  aVar2.m_data = operator_new(0x38);
  QLineEdit::QLineEdit((QLineEdit *)aVar2.m_data,&QFileDialog->super_QWidget);
  *(undefined ***)aVar2.m_data = &PTR_metaObject_00801df8;
  *(undefined ***)((long)aVar2.m_data + 0x10) = &PTR__QFileDialogLineEdit_00801fb0;
  *(QFileDialogPrivate **)((long)aVar2.m_data + 0x30) = (QFileDialogPrivate *)0x0;
  this->fileNameEdit = (QFileDialogLineEdit *)aVar2;
  QVar27.m_size = (size_t)"fileNameEdit";
  QVar27.field_0.m_data = aVar2.m_data;
  QObject::setObjectName(QVar27);
  QVar1 = QWidget::sizePolicy((QWidget *)this->fileNameEdit);
  QWidget::setSizePolicy
            ((QWidget *)this->fileNameEdit,
             (QSizePolicy)(((uint)QVar1.field_0 & 0x20000000) + 0x70001));
  QGridLayout::addWidget(this->gridLayout,(QWidget *)this->fileNameEdit,2,1,1,1,(Alignment)0x0);
  aVar2.m_data = operator_new(0x28);
  QDialogButtonBox::QDialogButtonBox
            ((QDialogButtonBox *)aVar2.m_data_utf8,&QFileDialog->super_QWidget);
  this->buttonBox = (QDialogButtonBox *)aVar2;
  QVar28.m_size = (size_t)"buttonBox";
  QVar28.field_0.m_data = aVar2.m_data;
  QObject::setObjectName(QVar28);
  QDialogButtonBox::setOrientation((QDialogButtonBox *)this->buttonBox,Vertical);
  QDialogButtonBox::setStandardButtons
            ((QDialogButtonBox *)this->buttonBox,(StandardButtons)0x400400);
  QGridLayout::addWidget(this->gridLayout,&this->buttonBox->super_QWidget,2,2,2,1,(Alignment)0x0);
  aVar2.m_data = operator_new(0x28);
  QLabel::QLabel((QLabel *)aVar2.m_data,&QFileDialog->super_QWidget,(WindowFlags)0x0);
  this->fileTypeLabel = (QLabel *)aVar2;
  QVar29.m_size = (size_t)"fileTypeLabel";
  QVar29.field_0.m_data = aVar2.m_data;
  QObject::setObjectName(QVar29);
  QVar1 = QWidget::sizePolicy((QWidget *)this->fileTypeLabel);
  QWidget::setSizePolicy
            ((QWidget *)this->fileTypeLabel,
             (QSizePolicy)(((uint)QVar1.field_0 & 0x20000000) + 0x50000));
  QGridLayout::addWidget(this->gridLayout,(QWidget *)this->fileTypeLabel,3,0,1,1,(Alignment)0x0);
  aVar2.m_data = operator_new(0x28);
  QComboBox::QComboBox((QComboBox *)aVar2.m_data,&QFileDialog->super_QWidget);
  this->fileTypeCombo = (QComboBox *)aVar2;
  QVar30.m_size = (size_t)"fileTypeCombo";
  QVar30.field_0.m_data = aVar2.m_data;
  QObject::setObjectName(QVar30);
  QVar1 = QWidget::sizePolicy(&this->fileTypeCombo->super_QWidget);
  QWidget::setSizePolicy
            (&this->fileTypeCombo->super_QWidget,
             (QSizePolicy)((uint)QVar1.field_0 & 0x20000000 | 0x70000));
  QGridLayout::addWidget
            (this->gridLayout,&this->fileTypeCombo->super_QWidget,3,1,1,1,(Alignment)0x0);
  QWidget::setTabOrder((QWidget *)this->lookInCombo,(QWidget *)this->backButton);
  QWidget::setTabOrder((QWidget *)this->backButton,(QWidget *)this->forwardButton);
  QWidget::setTabOrder((QWidget *)this->forwardButton,(QWidget *)this->toParentButton);
  QWidget::setTabOrder((QWidget *)this->toParentButton,(QWidget *)this->newFolderButton);
  QWidget::setTabOrder((QWidget *)this->newFolderButton,(QWidget *)this->listModeButton);
  QWidget::setTabOrder((QWidget *)this->listModeButton,(QWidget *)this->detailModeButton);
  QWidget::setTabOrder((QWidget *)this->detailModeButton,(QWidget *)this->sidebar);
  QWidget::setTabOrder((QWidget *)this->sidebar,(QWidget *)this->treeView);
  QWidget::setTabOrder((QWidget *)this->treeView,(QWidget *)this->listView);
  QWidget::setTabOrder((QWidget *)this->listView,(QWidget *)this->fileNameEdit);
  QWidget::setTabOrder((QWidget *)this->fileNameEdit,&this->buttonBox->super_QWidget);
  QWidget::setTabOrder(&this->buttonBox->super_QWidget,&this->fileTypeCombo->super_QWidget);
  retranslateUi(this,QFileDialog);
  QStackedWidget::setCurrentIndex(this->stackedWidget,0);
  QMetaObject::connectSlotsByName((QObject *)QFileDialog);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void setupUi(QDialog *QFileDialog)
    {
        if (QFileDialog->objectName().isEmpty())
            QFileDialog->setObjectName("QFileDialog");
        QFileDialog->resize(521, 316);
        QFileDialog->setSizeGripEnabled(true);
        gridLayout = new QGridLayout(QFileDialog);
        gridLayout->setObjectName("gridLayout");
        lookInLabel = new QLabel(QFileDialog);
        lookInLabel->setObjectName("lookInLabel");

        gridLayout->addWidget(lookInLabel, 0, 0, 1, 1);

        hboxLayout = new QHBoxLayout();
        hboxLayout->setObjectName("hboxLayout");
        lookInCombo = new QFileDialogComboBox(QFileDialog);
        lookInCombo->setObjectName("lookInCombo");
        QSizePolicy sizePolicy(QSizePolicy::Policy::Ignored, QSizePolicy::Policy::Fixed);
        sizePolicy.setHorizontalStretch(1);
        sizePolicy.setVerticalStretch(0);
        sizePolicy.setHeightForWidth(lookInCombo->sizePolicy().hasHeightForWidth());
        lookInCombo->setSizePolicy(sizePolicy);
        lookInCombo->setMinimumSize(QSize(50, 0));

        hboxLayout->addWidget(lookInCombo);

        backButton = new QToolButton(QFileDialog);
        backButton->setObjectName("backButton");

        hboxLayout->addWidget(backButton);

        forwardButton = new QToolButton(QFileDialog);
        forwardButton->setObjectName("forwardButton");

        hboxLayout->addWidget(forwardButton);

        toParentButton = new QToolButton(QFileDialog);
        toParentButton->setObjectName("toParentButton");

        hboxLayout->addWidget(toParentButton);

        newFolderButton = new QToolButton(QFileDialog);
        newFolderButton->setObjectName("newFolderButton");

        hboxLayout->addWidget(newFolderButton);

        listModeButton = new QToolButton(QFileDialog);
        listModeButton->setObjectName("listModeButton");

        hboxLayout->addWidget(listModeButton);

        detailModeButton = new QToolButton(QFileDialog);
        detailModeButton->setObjectName("detailModeButton");

        hboxLayout->addWidget(detailModeButton);


        gridLayout->addLayout(hboxLayout, 0, 1, 1, 2);

        splitter = new QSplitter(QFileDialog);
        splitter->setObjectName("splitter");
        QSizePolicy sizePolicy1(QSizePolicy::Policy::Expanding, QSizePolicy::Policy::Expanding);
        sizePolicy1.setHorizontalStretch(0);
        sizePolicy1.setVerticalStretch(0);
        sizePolicy1.setHeightForWidth(splitter->sizePolicy().hasHeightForWidth());
        splitter->setSizePolicy(sizePolicy1);
        splitter->setOrientation(Qt::Horizontal);
        splitter->setChildrenCollapsible(false);
        sidebar = new QSidebar(splitter);
        sidebar->setObjectName("sidebar");
        splitter->addWidget(sidebar);
        frame = new QFrame(splitter);
        frame->setObjectName("frame");
        frame->setFrameShape(QFrame::NoFrame);
        frame->setFrameShadow(QFrame::Raised);
        vboxLayout = new QVBoxLayout(frame);
        vboxLayout->setSpacing(0);
        vboxLayout->setObjectName("vboxLayout");
        vboxLayout->setContentsMargins(0, 0, 0, 0);
        stackedWidget = new QStackedWidget(frame);
        stackedWidget->setObjectName("stackedWidget");
        page = new QWidget();
        page->setObjectName("page");
        vboxLayout1 = new QVBoxLayout(page);
        vboxLayout1->setSpacing(0);
        vboxLayout1->setObjectName("vboxLayout1");
        vboxLayout1->setContentsMargins(0, 0, 0, 0);
        listView = new QFileDialogListView(page);
        listView->setObjectName("listView");

        vboxLayout1->addWidget(listView);

        stackedWidget->addWidget(page);
        page_2 = new QWidget();
        page_2->setObjectName("page_2");
        vboxLayout2 = new QVBoxLayout(page_2);
        vboxLayout2->setSpacing(0);
        vboxLayout2->setObjectName("vboxLayout2");
        vboxLayout2->setContentsMargins(0, 0, 0, 0);
        treeView = new QFileDialogTreeView(page_2);
        treeView->setObjectName("treeView");

        vboxLayout2->addWidget(treeView);

        stackedWidget->addWidget(page_2);

        vboxLayout->addWidget(stackedWidget);

        splitter->addWidget(frame);

        gridLayout->addWidget(splitter, 1, 0, 1, 3);

        fileNameLabel = new QLabel(QFileDialog);
        fileNameLabel->setObjectName("fileNameLabel");
        QSizePolicy sizePolicy2(QSizePolicy::Policy::Minimum, QSizePolicy::Policy::Preferred);
        sizePolicy2.setHorizontalStretch(0);
        sizePolicy2.setVerticalStretch(0);
        sizePolicy2.setHeightForWidth(fileNameLabel->sizePolicy().hasHeightForWidth());
        fileNameLabel->setSizePolicy(sizePolicy2);
        fileNameLabel->setMinimumSize(QSize(0, 0));

        gridLayout->addWidget(fileNameLabel, 2, 0, 1, 1);

        fileNameEdit = new QFileDialogLineEdit(QFileDialog);
        fileNameEdit->setObjectName("fileNameEdit");
        QSizePolicy sizePolicy3(QSizePolicy::Policy::Expanding, QSizePolicy::Policy::Fixed);
        sizePolicy3.setHorizontalStretch(1);
        sizePolicy3.setVerticalStretch(0);
        sizePolicy3.setHeightForWidth(fileNameEdit->sizePolicy().hasHeightForWidth());
        fileNameEdit->setSizePolicy(sizePolicy3);

        gridLayout->addWidget(fileNameEdit, 2, 1, 1, 1);

        buttonBox = new QDialogButtonBox(QFileDialog);
        buttonBox->setObjectName("buttonBox");
        buttonBox->setOrientation(Qt::Vertical);
        buttonBox->setStandardButtons(QDialogButtonBox::Cancel|QDialogButtonBox::Ok);

        gridLayout->addWidget(buttonBox, 2, 2, 2, 1);

        fileTypeLabel = new QLabel(QFileDialog);
        fileTypeLabel->setObjectName("fileTypeLabel");
        QSizePolicy sizePolicy4(QSizePolicy::Policy::Preferred, QSizePolicy::Policy::Fixed);
        sizePolicy4.setHorizontalStretch(0);
        sizePolicy4.setVerticalStretch(0);
        sizePolicy4.setHeightForWidth(fileTypeLabel->sizePolicy().hasHeightForWidth());
        fileTypeLabel->setSizePolicy(sizePolicy4);

        gridLayout->addWidget(fileTypeLabel, 3, 0, 1, 1);

        fileTypeCombo = new QComboBox(QFileDialog);
        fileTypeCombo->setObjectName("fileTypeCombo");
        QSizePolicy sizePolicy5(QSizePolicy::Policy::Expanding, QSizePolicy::Policy::Fixed);
        sizePolicy5.setHorizontalStretch(0);
        sizePolicy5.setVerticalStretch(0);
        sizePolicy5.setHeightForWidth(fileTypeCombo->sizePolicy().hasHeightForWidth());
        fileTypeCombo->setSizePolicy(sizePolicy5);

        gridLayout->addWidget(fileTypeCombo, 3, 1, 1, 1);

        QWidget::setTabOrder(lookInCombo, backButton);
        QWidget::setTabOrder(backButton, forwardButton);
        QWidget::setTabOrder(forwardButton, toParentButton);
        QWidget::setTabOrder(toParentButton, newFolderButton);
        QWidget::setTabOrder(newFolderButton, listModeButton);
        QWidget::setTabOrder(listModeButton, detailModeButton);
        QWidget::setTabOrder(detailModeButton, sidebar);
        QWidget::setTabOrder(sidebar, treeView);
        QWidget::setTabOrder(treeView, listView);
        QWidget::setTabOrder(listView, fileNameEdit);
        QWidget::setTabOrder(fileNameEdit, buttonBox);
        QWidget::setTabOrder(buttonBox, fileTypeCombo);

        retranslateUi(QFileDialog);

        stackedWidget->setCurrentIndex(0);


        QMetaObject::connectSlotsByName(QFileDialog);
    }